

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_stream.c
# Opt level: O0

int log_aspect_stream_impl_write_cb
              (log_aspect aspect,log_policy policy,log_aspect_notify_data notify_data)

{
  int iVar1;
  undefined8 *puVar2;
  log_aspect aspect_00;
  undefined8 *puVar3;
  size_t __size;
  void *__ptr;
  undefined8 *in_RDX;
  log_policy in_RSI;
  int result;
  void *buffer;
  size_t size;
  log_aspect_format_impl format_impl;
  log_aspect format;
  log_policy_stream_impl stream_impl;
  log_aspect_stream_write_cb_data write_args;
  int local_54;
  int local_4;
  
  puVar2 = (undefined8 *)log_policy_derived(in_RSI);
  aspect_00 = log_impl_aspect((log_impl)*in_RDX,LOG_ASPECT_FORMAT);
  puVar3 = (undefined8 *)log_aspect_derived(aspect_00);
  __size = (*(code *)*puVar3)(aspect_00,in_RDX[1]);
  if (__size == 0) {
    local_4 = 1;
  }
  else {
    __ptr = malloc(__size);
    local_54 = 1;
    if (__ptr == (void *)0x0) {
      local_4 = 1;
    }
    else {
      iVar1 = (*(code *)puVar3[1])(aspect_00,in_RDX[1],__ptr,__size);
      if (iVar1 == 0) {
        iVar1 = (*(code *)*puVar2)(in_RSI,__ptr,__size);
        if (iVar1 == 0) {
          local_54 = (*(code *)puVar2[1])(in_RSI);
        }
        free(__ptr);
        local_4 = local_54;
      }
      else {
        free(__ptr);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int log_aspect_stream_impl_write_cb(log_aspect aspect, log_policy policy, log_aspect_notify_data notify_data)
{
	log_aspect_stream_write_cb_data write_args = notify_data;

	log_policy_stream_impl stream_impl = log_policy_derived(policy);

	log_aspect format = log_impl_aspect(write_args->impl, LOG_ASPECT_FORMAT);

	log_aspect_format_impl format_impl = log_aspect_derived(format);

	size_t size = format_impl->size(format, write_args->record);

	(void)aspect;

	if (size == 0)
	{
		return 1;
	}

	/* TODO: remove this, use storage policy instead */
	{
		void *buffer = malloc(size);

		int result = 1;

		if (buffer == NULL)
		{
			return 1;
		}

		if (format_impl->serialize(format, write_args->record, buffer, size) != 0)
		{
			free(buffer);

			return 1;
		}

		if (stream_impl->write(policy, buffer, size) == 0)
		{
			result = stream_impl->flush(policy);
		}

		free(buffer);

		return result;
	}
}